

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,string *arg_lang)

{
  ulong uVar1;
  cmake *pcVar2;
  pointer pcVar3;
  key_type *pkVar4;
  key_type *pkVar5;
  pointer pbVar6;
  pointer pbVar7;
  bool bVar8;
  __uniq_ptr_data<cmMakefile,_std::default_delete<cmMakefile>,_true,_true> this_00;
  ValueHolder VVar9;
  Value *pVVar10;
  long *plVar11;
  Value *this_01;
  mapped_type *pmVar12;
  pointer pcVar13;
  string *psVar14;
  iterator iVar15;
  undefined8 *puVar16;
  cmMakefile *pcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  cmDyndepObjectInfo *object;
  undefined8 uVar20;
  _Elt_pointer pEVar21;
  Location *ppCVar22;
  _Elt_pointer pEVar23;
  Value *__range3;
  key_type *pkVar24;
  key_type *__k;
  const_iterator cVar25;
  string target_mods_file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_files;
  vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> objects;
  Value tm;
  cmGeneratedFileStream tmf;
  cmGeneratedFileStream ddf;
  iterator i;
  undefined1 local_658 [8];
  size_type local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  pointer local_638;
  ValueHolder local_630;
  long local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  undefined1 local_608 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  pointer local_5e8;
  cmGlobalNinjaGenerator *local_5e0;
  ValueHolder local_5d8;
  _Alloc_hider local_5d0;
  undefined1 local_5c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_5a0;
  string local_588;
  vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> local_568;
  string *local_548;
  Value local_540;
  _Hash_node_base *local_518;
  _Map_pointer local_510;
  _Hash_node_base local_508;
  _Elt_pointer ppVStack_500;
  undefined1 local_4f8 [8];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Alloc_hider local_4d8;
  _Map_pointer local_4d0;
  _Hash_node_base local_4c8 [2];
  pointer local_4b8;
  pointer pbStack_4b0;
  undefined1 local_4a8 [16];
  _Elt_pointer local_498;
  _Elt_pointer pEStack_490;
  _Elt_pointer local_488;
  pointer pbStack_480;
  _Elt_pointer local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_470;
  _Alloc_hider local_458;
  pointer pbStack_450;
  undefined1 local_448 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440;
  _Alloc_hider local_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400 [21];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [584];
  Value local_58;
  undefined4 extraout_var;
  
  pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  local_4e8._M_allocated_capacity = (pcVar2->CurrentSnapshot).Position.Position;
  local_4f8 = (undefined1  [8])(pcVar2->CurrentSnapshot).State;
  pcStack_4f0 = (pcVar2->CurrentSnapshot).Position.Tree;
  local_5e0 = (cmGlobalNinjaGenerator *)dir_top_bld;
  local_548 = arg_dd;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2b0,(cmStateSnapshot *)local_4f8);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_2b0,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2b0,(cmStateSnapshot *)local_4f8);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_2b0,dir_cur_bld);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2b0,(cmStateSnapshot *)local_4f8);
  cmStateDirectory::SetRelativePathTopSource
            ((cmStateDirectory *)local_2b0,(dir_top_src->_M_dataplus)._M_p);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_2b0,(cmStateSnapshot *)local_4f8);
  cmStateDirectory::SetRelativePathTopBinary
            ((cmStateDirectory *)local_2b0,
             ((_Alloc_hider *)&local_5e0->super_cmGlobalCommonGenerator)->_M_p);
  this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)operator_new(0x7e8);
  cmMakefile::cmMakefile
            ((cmMakefile *)
             this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(cmGlobalGenerator *)this,
             (cmStateSnapshot *)local_4f8);
  local_2b0._0_8_ =
       this_00.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  VVar9._0_4_ = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[2])
                          (this,this_00.
                                super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                                .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  local_5d8 = (ValueHolder)local_2b0._0_8_;
  VVar9.int_._4_4_ = extraout_var;
  local_2b0._0_8_ = (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x0;
  std::vector<cmMakefile*,std::allocator<cmMakefile*>>::emplace_back<cmMakefile*>
            ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
             (cmMakefile **)&local_5d8.map_);
  local_5e0 = this;
  local_5d8 = VVar9;
  std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::emplace_back<cmLocalGenerator*>
            ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (cmLocalGenerator **)&local_5d8.map_);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)local_2b0);
  local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar13 = (pointer)(arg_ddis->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
  local_5e8 = (pointer)(arg_ddis->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar13 != local_5e8) {
    do {
      Json::Value::Value(&local_540,nullValue);
      std::ifstream::ifstream(local_2b0,(pcVar13->Object)._M_dataplus._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)local_4f8);
      bVar8 = Json::Reader::parse((Reader *)local_4f8,(istream *)local_2b0,&local_540,false);
      local_638 = (pointer)CONCAT71(local_638._1_7_,bVar8);
      if (bVar8) {
        local_5d8.string_ = local_5c8;
        local_5d0._M_p = (pointer)0x0;
        local_5c8._0_8_ = local_5c8._0_8_ & 0xffffffffffffff00;
        vStack_5a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_5a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_5b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_5a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_5b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_5b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pVVar10 = Json::Value::operator[](&local_540,"object");
        Json::Value::asString_abi_cxx11_((string *)&local_630,pVVar10);
        std::__cxx11::string::operator=((string *)&local_5d8.bool_,(string *)&local_630.bool_);
        if (local_630 != &local_620) {
          operator_delete(local_630.string_,local_620._M_allocated_capacity + 1);
        }
        pVVar10 = Json::Value::operator[](&local_540,"provides");
        bVar8 = Json::Value::isArray(pVVar10);
        if (bVar8) {
          cVar25 = Json::Value::begin(pVVar10);
          local_658 = (undefined1  [8])cVar25.super_ValueIteratorBase.current_._M_node;
          local_650 = CONCAT71(local_650._1_7_,cVar25.super_ValueIteratorBase.isNull_);
          cVar25 = Json::Value::end(pVVar10);
          local_608._0_8_ = cVar25.super_ValueIteratorBase.current_._M_node;
          local_608[8] = cVar25.super_ValueIteratorBase.isNull_;
          while (bVar8 = Json::ValueIteratorBase::isEqual
                                   ((ValueIteratorBase *)local_658,(SelfType *)local_608), !bVar8) {
            pVVar10 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_658);
            Json::Value::asString_abi_cxx11_((string *)&local_630,pVVar10);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_5b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_630);
            if (local_630 != &local_620) {
              operator_delete(local_630.string_,local_620._M_allocated_capacity + 1);
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)local_658);
          }
        }
        pVVar10 = Json::Value::operator[](&local_540,"requires");
        bVar8 = Json::Value::isArray(pVVar10);
        if (bVar8) {
          cVar25 = Json::Value::begin(pVVar10);
          local_658 = (undefined1  [8])cVar25.super_ValueIteratorBase.current_._M_node;
          local_650 = CONCAT71(local_650._1_7_,cVar25.super_ValueIteratorBase.isNull_);
          cVar25 = Json::Value::end(pVVar10);
          local_608._0_8_ = cVar25.super_ValueIteratorBase.current_._M_node;
          local_608[8] = cVar25.super_ValueIteratorBase.isNull_;
          while (bVar8 = Json::ValueIteratorBase::isEqual
                                   ((ValueIteratorBase *)local_658,(SelfType *)local_608), !bVar8) {
            pVVar10 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_658);
            Json::Value::asString_abi_cxx11_((string *)&local_630,pVVar10);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &vStack_5a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_630);
            if (local_630 != &local_620) {
              operator_delete(local_630.string_,local_620._M_allocated_capacity + 1);
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)local_658);
          }
        }
        std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::
        emplace_back<cmDyndepObjectInfo>(&local_568,(cmDyndepObjectInfo *)&local_5d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_5a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_5b8);
        uVar20 = local_5c8._0_8_;
        VVar9 = local_5d8;
        if (local_5d8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8) {
LAB_0027fce2:
          operator_delete(VVar9.string_,uVar20 + 1);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_630,"-E cmake_ninja_dyndep failed to parse ",&pcVar13->Object);
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((string *)local_658,(Reader *)local_4f8);
        uVar20 = 0xf;
        if (local_630 != &local_620) {
          uVar20 = local_620._M_allocated_capacity;
        }
        if ((ulong)uVar20 < local_650 + local_628) {
          uVar20 = 0xf;
          if (local_658 != (undefined1  [8])&local_648) {
            uVar20 = local_648._M_allocated_capacity;
          }
          if ((ulong)uVar20 < local_650 + local_628) goto LAB_0027fb2a;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)local_658,0,(char *)0x0,local_630.uint_);
        }
        else {
LAB_0027fb2a:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_630.int_,(ulong)local_658);
        }
        local_5d8.string_ = local_5c8;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar19) {
          local_5c8._0_8_ = paVar19->_M_allocated_capacity;
          local_5c8._8_8_ = puVar16[3];
        }
        else {
          local_5c8._0_8_ = paVar19->_M_allocated_capacity;
          local_5d8.string_ = ((char *)*puVar16).string_;
        }
        local_5d0._M_p = (pointer)puVar16[1];
        *puVar16 = paVar19;
        puVar16[1] = 0;
        paVar19->_M_local_buf[0] = '\0';
        cmSystemTools::Error((string *)&local_5d8);
        if (local_5d8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8) {
          operator_delete(local_5d8.string_,local_5c8._0_8_ + 1);
        }
        if (local_658 != (undefined1  [8])&local_648) {
          operator_delete((void *)local_658,local_648._M_allocated_capacity + 1);
        }
        uVar20 = local_620._M_allocated_capacity;
        VVar9 = local_630;
        if (local_630 != &local_620) goto LAB_0027fce2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_p != local_400) {
        operator_delete(local_410._M_p,
                        CONCAT71(local_400[0]._M_allocated_capacity._1_7_,
                                 local_400[0]._M_local_buf[0]) + 1);
      }
      if (local_458._M_p != local_448) {
        operator_delete(local_458._M_p,(long)local_448 + 1);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                 local_4a8);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_4f8);
      std::ifstream::~ifstream(local_2b0);
      Json::Value::~Value(&local_540);
      if ((char)local_638 == '\0') {
        bVar8 = false;
        goto LAB_00280701;
      }
      pcVar13 = (pointer)&pcVar13->Provides;
    } while (pcVar13 != local_5e8);
  }
  local_5c8._8_8_ = &local_5d0;
  local_5d0._M_p = local_5d0._M_p & 0xffffffff00000000;
  local_5c8._0_8_ = 0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar13 = (pointer)(linked_target_dirs->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
  local_5e8 = (pointer)(linked_target_dirs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5c8._8_8_;
  if (pcVar13 != local_5e8) {
    pVVar10 = (Value *)(local_2a0 + 0x238);
    do {
      local_4f8 = (undefined1  [8])&local_4e8;
      pcVar3 = (pcVar13->Object)._M_dataplus._M_p;
      local_638 = pcVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4f8,pcVar3,pcVar3 + (pcVar13->Object)._M_string_length);
      std::__cxx11::string::append((char *)local_4f8);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_4f8,(ulong)(arg_lang->_M_dataplus)._M_p);
      local_2b0._0_8_ = local_2b0 + 0x10;
      pcVar17 = (cmMakefile *)(plVar11 + 2);
      paVar19 = &local_588.field_2;
      if ((cmMakefile *)*plVar11 == pcVar17) {
        local_2a0._0_8_ =
             (pcVar17->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map;
        local_2a0._8_8_ = plVar11[3];
      }
      else {
        local_2a0._0_8_ =
             (pcVar17->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map;
        local_2b0._0_8_ = (cmMakefile *)*plVar11;
      }
      local_2b0._8_8_ = plVar11[1];
      *plVar11 = (long)pcVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_2b0);
      local_658 = (undefined1  [8])&local_648;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar18) {
        local_648._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_648._8_8_ = plVar11[3];
      }
      else {
        local_648._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_658 = (undefined1  [8])*plVar11;
      }
      local_650 = plVar11[1];
      *plVar11 = (long)paVar18;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((cmMakefile *)local_2b0._0_8_ != (cmMakefile *)(local_2b0 + 0x10)) {
        operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
      }
      if (local_4f8 != (undefined1  [8])&local_4e8) {
        operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
      }
      Json::Value::Value(&local_540,nullValue);
      std::ifstream::ifstream(local_2b0,(char *)local_658,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)local_4f8);
      if (((*(byte *)((long)&((((cmMakefile *)(local_2b0._0_8_ + -0x7e8))->WarnedCMP0074)._M_t.
                              _M_impl.super__Rb_tree_header._M_header._M_right)->_M_left +
                     (long)local_2a0) & 5) == 0) &&
         (bVar8 = Json::Reader::parse((Reader *)local_4f8,(istream *)local_2b0,&local_540,false),
         !bVar8)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_608,"-E cmake_ninja_dyndep failed to parse ",&local_638->Object);
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_588,(Reader *)local_4f8);
        uVar1 = local_588._M_string_length + CONCAT71(local_608._9_7_,local_608[8]);
        uVar20 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._0_8_ != &local_5f8) {
          uVar20 = local_5f8._M_allocated_capacity;
        }
        if ((ulong)uVar20 < uVar1) {
          uVar20 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != paVar19) {
            uVar20 = local_588.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar20 < uVar1) goto LAB_0028079b;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_588,0,(char *)0x0,local_608._0_8_);
        }
        else {
LAB_0028079b:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_608,(ulong)local_588._M_dataplus._M_p);
        }
        local_630.string_ = (char *)&local_620;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 == paVar18) {
          local_620._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_620._8_8_ = puVar16[3];
        }
        else {
          local_620._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_630.string_ = ((char *)*puVar16).string_;
        }
        local_628 = puVar16[1];
        *puVar16 = paVar18;
        puVar16[1] = 0;
        paVar18->_M_local_buf[0] = '\0';
        cmSystemTools::Error((string *)&local_630);
        if (local_630 != &local_620) {
          operator_delete(local_630.string_,local_620._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != paVar19) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_608._0_8_ != &local_5f8) {
          operator_delete((void *)local_608._0_8_,local_5f8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_p != local_400) {
          operator_delete(local_410._M_p,
                          CONCAT71(local_400[0]._M_allocated_capacity._1_7_,
                                   local_400[0]._M_local_buf[0]) + 1);
        }
        if (local_458._M_p != local_448) {
          operator_delete(local_458._M_p,(long)local_448 + 1);
        }
        std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                  ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                   local_4a8);
        std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                  ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_4f8);
        std::ifstream::~ifstream(local_2b0);
        Json::Value::~Value(&local_540);
        if (local_658 != (undefined1  [8])&local_648) {
          operator_delete((void *)local_658,local_648._M_allocated_capacity + 1);
        }
        bVar8 = false;
        goto LAB_002806f4;
      }
      bVar8 = Json::Value::isObject(&local_540);
      if (bVar8) {
        Json::Value::begin(pVVar10);
        while( true ) {
          Json::Value::end((Value *)&local_630);
          bVar8 = Json::ValueIteratorBase::isEqual
                            ((ValueIteratorBase *)pVVar10,(SelfType *)&local_630);
          if (bVar8) break;
          this_01 = Json::ValueIteratorBase::deref((ValueIteratorBase *)pVVar10);
          Json::Value::asString_abi_cxx11_((string *)local_608,this_01);
          Json::ValueIteratorBase::key((Value *)&local_630,(ValueIteratorBase *)pVVar10);
          Json::Value::asString_abi_cxx11_(&local_588,(Value *)&local_630);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_5d8,&local_588);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)local_608);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != paVar19) {
            operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          }
          Json::Value::~Value((Value *)&local_630);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._0_8_ != &local_5f8) {
            operator_delete((void *)local_608._0_8_,local_5f8._M_allocated_capacity + 1);
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)pVVar10);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_p != local_400) {
        operator_delete(local_410._M_p,
                        CONCAT71(local_400[0]._M_allocated_capacity._1_7_,
                                 local_400[0]._M_local_buf[0]) + 1);
      }
      if (local_458._M_p != local_448) {
        operator_delete(local_458._M_p,(long)local_448 + 1);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                 local_4a8);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_4f8);
      std::ifstream::~ifstream(local_2b0);
      Json::Value::~Value(&local_540);
      if (local_658 != (undefined1  [8])&local_648) {
        operator_delete((void *)local_658,local_648._M_allocated_capacity + 1);
      }
      pcVar13 = (pointer)&local_638->Provides;
    } while (pcVar13 != local_5e8);
  }
  Json::Value::Value(&local_540,objectValue);
  local_5e8 = local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar13 = local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pkVar4 = (pcVar13->Provides).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_638 = pcVar13;
      for (pkVar24 = (pcVar13->Provides).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pkVar24 != pkVar4;
          pkVar24 = pkVar24 + 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,module_dir,pkVar24);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_5d8,pkVar24);
        std::__cxx11::string::_M_assign((string *)pmVar12);
        Json::Value::Value(&local_58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b0);
        pVVar10 = Json::Value::operator[](&local_540,pkVar24);
        Json::Value::operator=(pVVar10,&local_58);
        Json::Value::~Value(&local_58);
        if ((cmMakefile *)local_2b0._0_8_ != (cmMakefile *)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._0_8_ + 1));
        }
      }
      pcVar13 = local_638 + 1;
    } while (pcVar13 != local_5e8);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2b0,local_548,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2b0,"ninja_dyndep_version = 1.0\n",0x1b);
  local_518 = &local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"dyndep","");
  local_4f8 = (undefined1  [8])&local_4e8;
  pcStack_4f0 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_4e8._M_allocated_capacity = local_4e8._M_allocated_capacity & 0xffffffffffffff00;
  local_4d8._M_p = (pointer)local_4c8;
  if (local_518 == &local_508) {
    local_4c8[1]._M_nxt = (_Hash_node_base *)ppVStack_500;
  }
  else {
    local_4d8._M_p = (pointer)local_518;
  }
  local_4d0 = local_510;
  local_510 = (_Map_pointer)0x0;
  local_508._M_nxt._0_1_ = 0;
  local_440._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_440._M_impl.super__Rb_tree_header._M_header;
  local_440._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_440._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8 = (pointer)0x0;
  pbStack_4b0 = (pointer)0x0;
  local_4a8._0_8_ = (pointer)0x0;
  local_4a8._8_8_ = (_Elt_pointer)0x0;
  local_498 = (_Elt_pointer)0x0;
  pEStack_490 = (_Elt_pointer)0x0;
  local_488 = (_Elt_pointer)0x0;
  pbStack_480 = (pointer)0x0;
  local_478 = (_Elt_pointer)0x0;
  vStack_470.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_470.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_470.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458._M_p = (pointer)0x0;
  pbStack_450 = (pointer)0x0;
  local_448 = (undefined1  [8])0x0;
  local_440._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_410._M_p = (pointer)local_400;
  local_408 = 0;
  local_400[0]._M_local_buf[0] = '\0';
  local_518 = &local_508;
  local_440._M_impl.super__Rb_tree_header._M_header._M_right =
       local_440._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4b8,
             (char (*) [1])0x550d1e);
  local_638 = local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar13 = local_568.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::_M_assign((string *)local_4b8);
      pEVar23 = local_498;
      uVar20 = local_4a8._8_8_;
      if (local_498 != (_Elt_pointer)local_4a8._8_8_) {
        ppCVar22 = &((Token *)local_4a8._8_8_)->end_;
        do {
          if (ppCVar22 != (Location *)*(long **)(ppCVar22 + -2)) {
            operator_delete(*(long **)(ppCVar22 + -2),(ulong)(*ppCVar22 + 1));
          }
          pEVar21 = (_Elt_pointer)(ppCVar22 + 2);
          ppCVar22 = ppCVar22 + 4;
        } while (pEVar21 != pEVar23);
        local_498 = (_Elt_pointer)uVar20;
      }
      pkVar4 = (pcVar13->Provides).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pkVar24 = (pcVar13->Provides).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 = vStack_470.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          pbVar6 = vStack_470.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, pkVar24 != pkVar4;
          pkVar24 = pkVar24 + 1) {
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_5d8,pkVar24);
        psVar14 = ConvertToNinjaPath(local_5e0,pmVar12);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_4a8 + 8),psVar14);
      }
      if (vStack_470.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          vStack_470.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        ppCVar22 = &((Token *)
                    &(vStack_470.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->end_;
        do {
          if (ppCVar22 != (Location *)*(long **)(ppCVar22 + -2)) {
            operator_delete(*(long **)(ppCVar22 + -2),(ulong)(*ppCVar22 + 1));
          }
          pEVar23 = (_Elt_pointer)(ppCVar22 + 2);
          ppCVar22 = ppCVar22 + 4;
        } while (pEVar23 != (_Elt_pointer)pbVar7);
        vStack_470.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
      }
      pkVar5 = (pcVar13->Requires).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (pcVar13->Requires).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pkVar5; __k = __k + 1) {
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_5d8,__k);
        if (iVar15._M_node != (_Base_ptr)&local_5d0) {
          psVar14 = ConvertToNinjaPath(local_5e0,(string *)(iVar15._M_node + 2));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&vStack_470,psVar14);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&local_440);
      if ((pcVar13->Provides).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar13->Provides).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const(&)[7],char_const(&)[2]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_440,(char (*) [7])"restat",(char (*) [2])0x561d58);
      }
      WriteBuild(local_5e0,(ostream *)local_2b0,(cmNinjaBuild *)local_4f8,0,(bool *)0x0);
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 != local_638);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_4f8);
  cmsys::SystemTools::GetFilenamePath((string *)local_608,local_548);
  plVar11 = (long *)std::__cxx11::string::append(local_608);
  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 == paVar19) {
    local_648._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_648._8_8_ = plVar11[3];
    local_658 = (undefined1  [8])&local_648;
  }
  else {
    local_648._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_658 = (undefined1  [8])*plVar11;
  }
  local_650 = plVar11[1];
  *plVar11 = (long)paVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append(local_658,(ulong)(arg_lang->_M_dataplus)._M_p);
  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 == paVar19) {
    local_4e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_4e8._8_8_ = plVar11[3];
    local_4f8 = (undefined1  [8])&local_4e8;
  }
  else {
    local_4e8._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_4f8 = (undefined1  [8])*plVar11;
  }
  pcStack_4f0 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)plVar11[1];
  *plVar11 = (long)paVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  puVar16 = (undefined8 *)std::__cxx11::string::append(local_4f8);
  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar16 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 == paVar19) {
    local_620._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_620._8_8_ = puVar16[3];
    local_630.string_ = (char *)&local_620;
  }
  else {
    local_620._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_630.string_ = ((char *)*puVar16).string_;
  }
  local_628 = puVar16[1];
  *puVar16 = paVar19;
  puVar16[1] = 0;
  *(undefined1 *)(puVar16 + 2) = 0;
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  if (local_658 != (undefined1  [8])&local_648) {
    operator_delete((void *)local_658,local_648._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._0_8_ != &local_5f8) {
    operator_delete((void *)local_608._0_8_,local_5f8._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_4f8,(string *)&local_630,false,None);
  Json::operator<<((ostream *)local_4f8,&local_540);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4f8);
  if (local_630 != &local_620) {
    operator_delete(local_630.string_,local_620._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
  Json::Value::~Value(&local_540);
  bVar8 = true;
LAB_002806f4:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_5d8);
LAB_00280701:
  std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::~vector(&local_568);
  return bVar8;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::string const& arg_lang)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    snapshot.GetDirectory().SetRelativePathTopSource(dir_top_src.c_str());
    snapshot.GetDirectory().SetRelativePathTopBinary(dir_top_bld.c_str());
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    std::unique_ptr<cmLocalNinjaGenerator> lgd(
      static_cast<cmLocalNinjaGenerator*>(
        this->CreateLocalGenerator(mfd.get())));
    this->Makefiles.push_back(mfd.release());
    this->LocalGenerators.push_back(lgd.release());
  }

  std::vector<cmDyndepObjectInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    // Load the ddi file and compute the module file paths it provides.
    Json::Value ddio;
    Json::Value const& ddi = ddio;
    cmsys::ifstream ddif(arg_ddi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(ddif, ddio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " + arg_ddi +
                           reader.getFormattedErrorMessages());
      return false;
    }

    cmDyndepObjectInfo info;
    info.Object = ddi["object"].asString();
    Json::Value const& ddi_provides = ddi["provides"];
    if (ddi_provides.isArray()) {
      for (auto const& ddi_provide : ddi_provides) {
        info.Provides.push_back(ddi_provide.asString());
      }
    }
    Json::Value const& ddi_requires = ddi["requires"];
    if (ddi_requires.isArray()) {
      for (auto const& ddi_require : ddi_requires) {
        info.Requires.push_back(ddi_require.asString());
      }
    }
    objects.push_back(std::move(info));
  }

  // Map from module name to module file path, if known.
  std::map<std::string, std::string> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      linked_target_dir + "/" + arg_lang + "Modules.json";
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (ltmf && !reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " +
                           linked_target_dir +
                           reader.getFormattedErrorMessages());
      return false;
    }
    if (ltm.isObject()) {
      for (Json::Value::iterator i = ltm.begin(); i != ltm.end(); ++i) {
        mod_files[i.key().asString()] = i->asString();
      }
    }
  }

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value tm = Json::objectValue;
  for (cmDyndepObjectInfo const& object : objects) {
    for (std::string const& p : object.Provides) {
      std::string const mod = module_dir + p;
      mod_files[p] = mod;
      tm[p] = mod;
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  {
    cmNinjaBuild build("dyndep");
    build.Outputs.emplace_back("");
    for (cmDyndepObjectInfo const& object : objects) {
      build.Outputs[0] = object.Object;
      build.ImplicitOuts.clear();
      for (std::string const& p : object.Provides) {
        build.ImplicitOuts.push_back(this->ConvertToNinjaPath(mod_files[p]));
      }
      build.ImplicitDeps.clear();
      for (std::string const& r : object.Requires) {
        auto mit = mod_files.find(r);
        if (mit != mod_files.end()) {
          build.ImplicitDeps.push_back(this->ConvertToNinjaPath(mit->second));
        }
      }
      build.Variables.clear();
      if (!object.Provides.empty()) {
        build.Variables.emplace("restat", "1");
      }

      this->WriteBuild(ddf, build);
    }
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file =
    cmSystemTools::GetFilenamePath(arg_dd) + "/" + arg_lang + "Modules.json";
  cmGeneratedFileStream tmf(target_mods_file);
  tmf << tm;

  return true;
}